

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int32_t nghttp2_session_get_stream_local_window_size(nghttp2_session *session,int32_t stream_id)

{
  int32_t iVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar2 = nghttp2_map_find(&session->streams,stream_id);
  if (((pvVar2 == (void *)0x0) || ((*(byte *)((long)pvVar2 + 0xd8) & 2) != 0)) ||
     (*(int *)((long)pvVar2 + 0xcc) == 5)) {
    iVar1 = -1;
  }
  else {
    iVar3 = *(int *)((long)pvVar2 + 0xbc) - *(int *)((long)pvVar2 + 0xb0);
    iVar1 = 0;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
  }
  return iVar1;
}

Assistant:

int32_t nghttp2_session_get_stream_local_window_size(nghttp2_session *session,
                                                     int32_t stream_id) {
  nghttp2_stream *stream;
  int32_t size;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return -1;
  }

  size = stream->local_window_size - stream->recv_window_size;

  /* size could be negative if local endpoint reduced
     SETTINGS_INITIAL_WINDOW_SIZE */
  if (size < 0) {
    return 0;
  }

  return size;
}